

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxleastsqsc.hpp
# Opt level: O1

void soplex::
     initConstVecs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *vecset,SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *facset,
               SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *veclogs,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *vecnnzinv,
               number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *epsilon)

{
  undefined8 *puVar1;
  uint *puVar2;
  byte bVar3;
  fpclass_type fVar4;
  int32_t iVar5;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar6;
  pointer pnVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  int iVar11;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this;
  long lVar12;
  long lVar13;
  long lVar14;
  double dVar15;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  nnzinv;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  logsum;
  int local_29c;
  cpp_dec_float<50U,_int,_void> local_298;
  Item *local_260;
  cpp_dec_float<50U,_int,_void> local_258;
  long local_218;
  long local_210;
  long local_208;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_200;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1f8;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1f0;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1e8;
  long local_1e0;
  cpp_dec_float<50U,_int,_void> local_1d8;
  uint local_198 [2];
  uint auStack_190 [2];
  uint local_188 [2];
  undefined8 uStack_180;
  undefined8 local_178;
  uint local_168 [2];
  uint auStack_160 [2];
  uint local_158 [2];
  undefined8 uStack_150;
  uint local_148 [4];
  uint local_138 [2];
  uint auStack_130 [2];
  uint local_128 [2];
  undefined8 uStack_120;
  uint local_118 [4];
  uint local_108 [2];
  uint auStack_100 [2];
  uint local_f8 [2];
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  uint local_c8 [2];
  undefined8 uStack_c0;
  uint local_b8 [4];
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_208 = (long)(vecset->set).thenum;
  if (0 < local_208) {
    lVar12 = 0;
    local_200 = vecset;
    local_1f8 = facset;
    local_1f0 = veclogs;
    local_1e8 = vecnnzinv;
    do {
      local_1d8.fpclass = cpp_dec_float_finite;
      local_1d8.prec_elem = 10;
      local_1d8.data._M_elems[0] = 0;
      local_1d8.data._M_elems[1] = 0;
      local_1d8.data._M_elems[2] = 0;
      local_1d8.data._M_elems[3] = 0;
      local_1d8.data._M_elems[4] = 0;
      local_1d8.data._M_elems[5] = 0;
      local_1d8.data._M_elems._24_5_ = 0;
      local_1d8.data._M_elems[7]._1_3_ = 0;
      local_1d8.data._M_elems[8] = 0;
      local_1d8.data._M_elems[9] = 0;
      local_1d8.exp = 0;
      local_1d8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_1d8,0.0);
      local_260 = (local_200->set).theitem + (local_200->set).thekey[lVar12].idx;
      local_210 = (long)(local_260->data).
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .memused;
      local_29c = 0;
      local_218 = lVar12;
      if (0 < local_210) {
        local_1e0 = local_210 * 0x3c;
        lVar12 = 0;
        local_29c = 0;
        do {
          pNVar6 = (local_260->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          local_b8._0_8_ = *(undefined8 *)((long)&(pNVar6->val).m_backend.data + lVar12 + 0x20);
          puVar1 = (undefined8 *)((long)&(pNVar6->val).m_backend.data + lVar12);
          local_d8 = *puVar1;
          uStack_d0 = puVar1[1];
          puVar2 = (uint *)((long)&(pNVar6->val).m_backend.data + lVar12 + 0x10);
          local_c8 = *(uint (*) [2])puVar2;
          uStack_c0 = *(undefined8 *)(puVar2 + 2);
          iVar11 = *(int *)((long)&(pNVar6->val).m_backend.data + lVar12 + 0x28);
          bVar3 = *(byte *)((long)&(pNVar6->val).m_backend.data + lVar12 + 0x2c);
          fVar4 = *(fpclass_type *)((long)&(pNVar6->val).m_backend.data + lVar12 + 0x30);
          iVar5 = *(int32_t *)((long)&(pNVar6->val).m_backend.data + lVar12 + 0x34);
          local_e8 = *(undefined8 *)((long)&(pNVar6->val).m_backend.data + lVar12 + 0x20);
          puVar2 = (uint *)((long)&(pNVar6->val).m_backend.data + lVar12);
          local_298.data._M_elems._0_8_ = *(undefined8 *)puVar2;
          local_298.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
          puVar2 = (uint *)((long)&(pNVar6->val).m_backend.data + lVar12 + 0x10);
          local_298.data._M_elems._16_8_ = *(undefined8 *)puVar2;
          uStack_f0 = *(undefined8 *)(puVar2 + 2);
          local_68.data._M_elems._0_8_ = *(undefined8 *)(epsilon->m_backend).data._M_elems;
          local_68.data._M_elems._8_8_ = *(undefined8 *)((epsilon->m_backend).data._M_elems + 2);
          local_68.data._M_elems._16_8_ = *(undefined8 *)((epsilon->m_backend).data._M_elems + 4);
          local_68.data._M_elems._24_8_ = *(undefined8 *)((epsilon->m_backend).data._M_elems + 6);
          local_68.data._M_elems._32_8_ = *(undefined8 *)((epsilon->m_backend).data._M_elems + 8);
          local_68.exp = (epsilon->m_backend).exp;
          local_68.neg = (epsilon->m_backend).neg;
          local_68.fpclass = (epsilon->m_backend).fpclass;
          local_68.prec_elem = (epsilon->m_backend).prec_elem;
          local_298.data._M_elems._32_5_ = SUB85(local_e8,0);
          local_298.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_e8 >> 0x28);
          local_298.data._M_elems._24_5_ = SUB85(uStack_f0,0);
          local_298.data._M_elems[7]._1_3_ = (undefined3)((ulong)uStack_f0 >> 0x28);
          local_298.prec_elem = iVar5;
          local_298.fpclass = fVar4;
          local_298.neg = (bool)bVar3;
          if ((bVar3 == 1) && (local_298.data._M_elems[0] != 0 || fVar4 != cpp_dec_float_finite)) {
            local_298.neg = false;
          }
          local_298.exp = iVar11;
          local_108 = (uint  [2])local_298.data._M_elems._0_8_;
          auStack_100 = (uint  [2])local_298.data._M_elems._8_8_;
          local_f8 = (uint  [2])local_298.data._M_elems._16_8_;
          if (local_68.fpclass == cpp_dec_float_NaN || fVar4 == cpp_dec_float_NaN) {
LAB_0017c5d0:
            local_258.data._M_elems[8] = local_b8[0];
            local_258.data._M_elems[9] = local_b8[1];
            local_258.data._M_elems[4] = local_c8[0];
            local_258.data._M_elems[5] = local_c8[1];
            local_258.data._M_elems._24_5_ = SUB85(uStack_c0,0);
            local_258.data._M_elems[7]._1_3_ = (undefined3)((ulong)uStack_c0 >> 0x28);
            local_258.data._M_elems._8_8_ = uStack_d0;
            local_258.data._M_elems._0_8_ = local_d8;
            auVar8 = (undefined1  [16])local_258.data._M_elems._0_16_;
            local_258.prec_elem = iVar5;
            local_258.fpclass = fVar4;
            local_258.neg = (bool)bVar3;
            if ((bVar3 != 0) &&
               (local_258.data._M_elems[0] = (uint)local_d8,
               fVar4 != cpp_dec_float_finite || local_258.data._M_elems[0] != 0)) {
              local_258.neg = (bool)(bVar3 ^ 1);
            }
            local_258.data._M_elems._0_16_ = auVar8;
            local_258.exp = iVar11;
            dVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::extract_double
                               (&local_258);
            dVar15 = log2(dVar15);
            local_298.fpclass = cpp_dec_float_finite;
            local_298.prec_elem = 10;
            local_298.data._M_elems[0] = 0;
            local_298.data._M_elems[1] = 0;
            local_298.data._M_elems[2] = 0;
            local_298.data._M_elems[3] = 0;
            local_298.data._M_elems[4] = 0;
            local_298.data._M_elems[5] = 0;
            local_298.data._M_elems._24_5_ = 0;
            local_298.data._M_elems[7]._1_3_ = 0;
            local_298.data._M_elems._32_5_ = 0;
            local_298.data._M_elems[9]._1_3_ = 0;
            local_298.exp = 0;
            local_298.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_298,dVar15);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_1d8,&local_298);
            local_29c = local_29c + 1;
          }
          else {
            iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_298,&local_68);
            if (0 < iVar10) goto LAB_0017c5d0;
          }
          lVar12 = lVar12 + 0x3c;
        } while (local_1e0 != lVar12);
      }
      local_258.fpclass = cpp_dec_float_finite;
      local_258.prec_elem = 10;
      local_258.data._M_elems[0] = 0;
      local_258.data._M_elems[1] = 0;
      local_258.data._M_elems[2] = 0;
      local_258.data._M_elems[3] = 0;
      local_258.data._M_elems[4] = 0;
      local_258.data._M_elems[5] = 0;
      local_258.data._M_elems._24_5_ = 0;
      local_258.data._M_elems[7]._1_3_ = 0;
      local_258.data._M_elems[8] = 0;
      local_258.data._M_elems[9] = 0;
      local_258.exp = 0;
      local_258.neg = false;
      if (local_29c < 1) {
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_1d8,1.0);
        dVar15 = 1.0;
      }
      else {
        dVar15 = 1.0 / (double)local_29c;
      }
      lVar12 = local_218;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_258,dVar15);
      auVar9 = (undefined1  [16])local_1d8.data._M_elems._0_16_;
      auVar8 = (undefined1  [16])local_258.data._M_elems._0_16_;
      local_118[0] = local_1d8.data._M_elems[8];
      local_118[1] = local_1d8.data._M_elems[9];
      uStack_120 = CONCAT35(local_1d8.data._M_elems[7]._1_3_,local_1d8.data._M_elems._24_5_);
      local_128[0] = local_1d8.data._M_elems[4];
      local_128[1] = local_1d8.data._M_elems[5];
      local_138[0] = local_1d8.data._M_elems[0];
      local_138[1] = local_1d8.data._M_elems[1];
      auStack_130[0] = local_1d8.data._M_elems[2];
      auStack_130[1] = local_1d8.data._M_elems[3];
      iVar11 = (local_1f0->super_IdxSet).num;
      (local_1f0->super_IdxSet).num = iVar11 + 1;
      pnVar7 = (local_1f0->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (local_1f0->super_IdxSet).idx[iVar11] = (int)lVar12;
      *(undefined8 *)((long)&pnVar7[lVar12].m_backend.data + 0x20) = local_1d8.data._M_elems._32_8_;
      puVar2 = (uint *)((long)&pnVar7[lVar12].m_backend.data + 0x10);
      *(undefined8 *)puVar2 = local_1d8.data._M_elems._16_8_;
      *(undefined8 *)(puVar2 + 2) = uStack_120;
      *(undefined8 *)&pnVar7[lVar12].m_backend.data = local_1d8.data._M_elems._0_8_;
      *(undefined8 *)((long)&pnVar7[lVar12].m_backend.data + 8) = local_1d8.data._M_elems._8_8_;
      pnVar7[lVar12].m_backend.exp = local_1d8.exp;
      pnVar7[lVar12].m_backend.neg = local_1d8.neg;
      pnVar7[lVar12].m_backend.fpclass = local_1d8.fpclass;
      pnVar7[lVar12].m_backend.prec_elem = local_1d8.prec_elem;
      local_148[0] = local_258.data._M_elems[8];
      local_148[1] = local_258.data._M_elems[9];
      uStack_150 = CONCAT35(local_258.data._M_elems[7]._1_3_,local_258.data._M_elems._24_5_);
      local_158[0] = local_258.data._M_elems[4];
      local_158[1] = local_258.data._M_elems[5];
      local_168[0] = local_258.data._M_elems[0];
      local_168[1] = local_258.data._M_elems[1];
      auStack_160[0] = local_258.data._M_elems[2];
      auStack_160[1] = local_258.data._M_elems[3];
      iVar11 = (local_1e8->super_IdxSet).num;
      (local_1e8->super_IdxSet).num = iVar11 + 1;
      pnVar7 = (local_1e8->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (local_1e8->super_IdxSet).idx[iVar11] = (int)lVar12;
      *(undefined8 *)((long)&pnVar7[lVar12].m_backend.data + 0x20) = local_258.data._M_elems._32_8_;
      puVar2 = (uint *)((long)&pnVar7[lVar12].m_backend.data + 0x10);
      *(undefined8 *)puVar2 = local_258.data._M_elems._16_8_;
      *(undefined8 *)(puVar2 + 2) = uStack_150;
      *(undefined8 *)&pnVar7[lVar12].m_backend.data = local_258.data._M_elems._0_8_;
      *(undefined8 *)((long)&pnVar7[lVar12].m_backend.data + 8) = local_258.data._M_elems._8_8_;
      pnVar7[lVar12].m_backend.exp = local_258.exp;
      pnVar7[lVar12].m_backend.neg = local_258.neg;
      pnVar7[lVar12].m_backend.fpclass = local_258.fpclass;
      pnVar7[lVar12].m_backend.prec_elem = local_258.prec_elem;
      local_258.data._M_elems._0_16_ = auVar8;
      local_1d8.data._M_elems._0_16_ = auVar9;
      this = SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::create(local_1f8,local_29c);
      if (0 < (int)local_210) {
        lVar13 = local_210 * 0x3c;
        lVar14 = 0;
        do {
          pNVar6 = (local_260->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          local_178 = *(undefined8 *)((long)&(pNVar6->val).m_backend.data + lVar14 + 0x20);
          puVar2 = (uint *)((long)&(pNVar6->val).m_backend.data + lVar14);
          local_298.data._M_elems._0_8_ = *(undefined8 *)puVar2;
          local_298.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
          puVar2 = (uint *)((long)&(pNVar6->val).m_backend.data + lVar14 + 0x10);
          local_298.data._M_elems._16_8_ = *(undefined8 *)puVar2;
          uStack_180 = *(undefined8 *)(puVar2 + 2);
          local_298.exp = *(int *)((long)&(pNVar6->val).m_backend.data + lVar14 + 0x28);
          local_298.neg = *(bool *)((long)&(pNVar6->val).m_backend.data + lVar14 + 0x2c);
          local_298._48_8_ = *(undefined8 *)((long)&(pNVar6->val).m_backend.data + lVar14 + 0x30);
          local_a8.data._M_elems._32_8_ = *(undefined8 *)((epsilon->m_backend).data._M_elems + 8);
          local_a8.data._M_elems._0_8_ = *(undefined8 *)(epsilon->m_backend).data._M_elems;
          local_a8.data._M_elems._8_8_ = *(undefined8 *)((epsilon->m_backend).data._M_elems + 2);
          local_a8.data._M_elems._16_8_ = *(undefined8 *)((epsilon->m_backend).data._M_elems + 4);
          local_a8.data._M_elems._24_8_ = *(undefined8 *)((epsilon->m_backend).data._M_elems + 6);
          local_a8.exp = (epsilon->m_backend).exp;
          local_a8.neg = (epsilon->m_backend).neg;
          local_a8.fpclass = (epsilon->m_backend).fpclass;
          local_a8.prec_elem = (epsilon->m_backend).prec_elem;
          local_298.data._M_elems._32_5_ = SUB85(local_178,0);
          local_298.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_178 >> 0x28);
          local_298.data._M_elems._24_5_ = SUB85(uStack_180,0);
          local_298.data._M_elems[7]._1_3_ = (undefined3)((ulong)uStack_180 >> 0x28);
          if ((local_298.neg == true) &&
             (local_298.data._M_elems[0] != 0 || local_298.fpclass != cpp_dec_float_finite)) {
            local_298.neg = false;
          }
          local_198 = (uint  [2])local_298.data._M_elems._0_8_;
          auStack_190 = (uint  [2])local_298.data._M_elems._8_8_;
          local_188 = (uint  [2])local_298.data._M_elems._16_8_;
          if (local_a8.fpclass == cpp_dec_float_NaN || local_298.fpclass == cpp_dec_float_NaN) {
LAB_0017c9a3:
            SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::add(this,*(int *)((long)(&((local_260->data).
                                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        .m_elem)->val + 1) + lVar14),
                  (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)&local_258);
          }
          else {
            iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_298,&local_a8);
            if (0 < iVar11) goto LAB_0017c9a3;
          }
          lVar14 = lVar14 + 0x3c;
        } while (lVar13 - lVar14 != 0);
      }
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::sort(this);
      lVar12 = lVar12 + 1;
    } while (lVar12 != local_208);
  }
  return;
}

Assistant:

static void initConstVecs(
   const SVSetBase<R>* vecset,
   SVSetBase<R>& facset,
   SSVectorBase<R>& veclogs,
   SSVectorBase<R>& vecnnzinv,
   R epsilon)
{
   assert(vecset != nullptr);

   const int nvec = vecset->num();

   for(int k = 0; k < nvec; ++k)
   {
      R logsum = 0.0;
      int nnz = 0;
      // get kth row or column of LP
      const SVectorBase<R>& lpvec = (*vecset)[k];
      const int size = lpvec.size();

      for(int i = 0; i < size; ++i)
      {
         const R a = lpvec.value(i);

         if(!isZero(a, epsilon))
         {
            logsum += log2(double(spxAbs(a))); // todo spxLog2?
            nnz++;
         }
      }

      R nnzinv;

      if(nnz > 0)
      {
         nnzinv = 1.0 / nnz;
      }
      else
      {
         /* all-0 entries */
         logsum = 1.0;
         nnzinv = 1.0;
      }

      veclogs.add(k, logsum);
      vecnnzinv.add(k, nnzinv);

      /* create new VectorBase<R> for facset */
      SVectorBase<R>& vecnew = (*(facset.create(nnz)));

      for(int i = 0; i < size; ++i)
      {
         if(!isZero(lpvec.value(i), epsilon))
            vecnew.add(lpvec.index(i), nnzinv);
      }

      vecnew.sort();
   }

   assert(veclogs.isSetup());
   assert(vecnnzinv.isSetup());
}